

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

Matrix<double,_3,_1> __thiscall
Matrix<double,_3,_1>::operator+(Matrix<double,_3,_1> *this,Matrix<double,_3,_1> *matrix)

{
  Matrix<double,_3,_1> MVar1;
  double *pdVar2;
  ostream *poVar3;
  int row;
  char *pcVar4;
  int col;
  Matrix<double,_3,_1> result;
  Matrix<double,_3,_1> local_40;
  double local_30;
  
  if ((matrix->rows == 0) || (matrix->cols == 0)) {
    pcVar4 = "can not plus two empty matrix!";
  }
  else {
    if ((matrix->rows == this->rows) && (matrix->cols == this->cols)) {
      local_40.data = (double *)0x0;
      local_40.rows = 3;
      local_40.cols = 1;
      local_40.data = (double *)operator_new__(0x18);
      if (0 < this->rows) {
        row = 0;
        do {
          if (0 < this->cols) {
            col = 0;
            do {
              pdVar2 = operator()(this,row,col);
              local_30 = *pdVar2;
              pdVar2 = operator()(matrix,row,col);
              SetElement(&local_40,row,col,local_30 + *pdVar2);
              col = col + 1;
            } while (col < this->cols);
          }
          row = row + 1;
        } while (row < this->rows);
      }
      MVar1.cols = local_40.cols;
      MVar1.rows = local_40.rows;
      MVar1.data = local_40.data;
      return MVar1;
    }
    pcVar4 = "can not plus matrix with different rows/cols";
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(-1);
}

Assistant:

int Matrix<Type, _0, _1>::row() const
{
    return this->rows;
}